

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOf_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::IsPartOf_PDU::Decode(IsPartOf_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  IsPartOf_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x34) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Simulation_Management_Header::Decode
            (&this->super_Simulation_Management_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,&(this->m_RelRec).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_LocPrt).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_NmLocID).super_DataTypeBase);
  DATA_TYPE::operator>>(pKVar2,&(this->m_PrtTyp).super_DataTypeBase);
  return;
}

Assistant:

void IsPartOf_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IS_PART_OF_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RelRec
           >> KDIS_STREAM m_LocPrt
           >> KDIS_STREAM m_NmLocID
           >> KDIS_STREAM m_PrtTyp;
}